

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

RefAST __thiscall ASTFactory::dupTree(ASTFactory *this,AST *t)

{
  AST *in_RDX;
  AST *this_00;
  RefCount<AST> local_30;
  RefAST local_28;
  
  create(this,t);
  if (in_RDX != (AST *)0x0) {
    if (this->_vptr_ASTFactory == (_func_int **)0x0) {
      this_00 = (AST *)0x0;
    }
    else {
      this_00 = (AST *)*this->_vptr_ASTFactory;
    }
    AST::getFirstChild(in_RDX);
    dupList((ASTFactory *)&local_28,t);
    AST::setFirstChild(this_00,&local_28);
    RefCount<AST>::~RefCount(&local_28);
    RefCount<AST>::~RefCount(&local_30);
  }
  return (RefAST)(Ref *)this;
}

Assistant:

RefAST ASTFactory::dupTree(const AST* t)
{
	RefAST result = dup(t);		// make copy of root
	// copy all children of root.
	if (t) {
		result->setFirstChild( dupList(t->getFirstChild()) );
	}
	return result;
}